

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int32_t cpu_get_num_math(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  pthread_t pVar4;
  int result;
  cpu_set_t affinity;
  int n_cpu;
  int in_stack_ffffffffffffff70;
  cpu_set_t local_88;
  int local_8;
  int32_t local_4;
  
  lVar3 = sysconf(0x54);
  local_8 = (int)lVar3;
  if (local_8 < 1) {
    local_4 = cpu_get_num_physical_cores();
  }
  else {
    bVar1 = is_hybrid_cpu();
    if (bVar1) {
      pVar4 = pthread_self();
      iVar2 = pthread_getaffinity_np(pVar4,0x80,&local_88);
      if (iVar2 == 0) {
        iVar2 = cpu_count_math_cpus(in_stack_ffffffffffffff70);
        pVar4 = pthread_self();
        pthread_setaffinity_np(pVar4,0x80,&local_88);
        if (0 < iVar2) {
          return iVar2;
        }
      }
    }
    local_4 = cpu_get_num_physical_cores();
  }
  return local_4;
}

Assistant:

int32_t cpu_get_num_math() {
#if defined(__x86_64__) && defined(__linux__) && !defined(__ANDROID__)
    int n_cpu = sysconf(_SC_NPROCESSORS_ONLN);
    if (n_cpu < 1) {
        return cpu_get_num_physical_cores();
    }
    if (is_hybrid_cpu()) {
        cpu_set_t affinity;
        if (!pthread_getaffinity_np(pthread_self(), sizeof(affinity), &affinity)) {
            int result = cpu_count_math_cpus(n_cpu);
            pthread_setaffinity_np(pthread_self(), sizeof(affinity), &affinity);
            if (result > 0) {
                return result;
            }
        }
    }
#endif
    return cpu_get_num_physical_cores();
}